

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::ExecuteLinkScript
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  cmsysProcess *cp;
  ostream *poVar7;
  char *pcVar8;
  char *cmd [2];
  string command;
  ifstream fin;
  byte abStack_218 [488];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x61) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    lVar6 = std::__cxx11::string::find((char *)(pbVar1 + 3),0x477998);
    if (lVar6 == 0) {
      std::__cxx11::string::substr
                ((ulong)&fin,
                 (ulong)((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 3));
      bVar2 = cmSystemTools::IsOff(_fin);
      std::__cxx11::string::~string((string *)&fin);
      bVar2 = !bVar2;
    }
  }
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    iVar5 = 1;
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Error allocating process instance in link script.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    iVar5 = 1;
    cmsysProcess_SetPipeShared(cp,2,1);
    cmsysProcess_SetPipeShared(cp,3,1);
    cmsysProcess_SetOption(cp,3,1);
    std::ifstream::ifstream
              (&fin,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,_S_in);
    if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
      command._M_dataplus._M_p = (pointer)&command.field_2;
      command._M_string_length = 0;
      command.field_2._M_local_buf[0] = '\0';
      iVar5 = 0;
      while (iVar5 == 0) {
        bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&command,(bool *)0x0,-1);
        if (!bVar3) break;
        iVar5 = 0;
        lVar6 = std::__cxx11::string::find_first_not_of((char *)&command,0x4779f1);
        if (lVar6 != -1) {
          cmd[0] = command._M_dataplus._M_p;
          cmd[1] = (char *)0x0;
          cmsysProcess_SetCommand(cp,cmd);
          if (bVar2) {
            poVar7 = std::operator<<((ostream *)&std::cout,(string *)&command);
            std::endl<char,std::char_traits<char>>(poVar7);
          }
          cmsysProcess_Execute(cp);
          cmsysProcess_WaitForExit(cp,(double *)0x0);
          iVar4 = cmsysProcess_GetState(cp);
          if (iVar4 == 1) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
            pcVar8 = cmsysProcess_GetErrorString(cp);
            poVar7 = std::operator<<(poVar7,pcVar8);
            std::endl<char,std::char_traits<char>>(poVar7);
            iVar5 = 2;
          }
          else if (iVar4 == 2) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
            pcVar8 = cmsysProcess_GetExceptionString(cp);
            poVar7 = std::operator<<(poVar7,pcVar8);
            std::endl<char,std::char_traits<char>>(poVar7);
            iVar5 = 1;
          }
          else {
            iVar5 = 0;
            if (iVar4 == 4) {
              iVar5 = cmsysProcess_GetExitValue(cp);
            }
          }
        }
      }
      cmsysProcess_Delete(cp);
      std::__cxx11::string::~string((string *)&command);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error opening link script \"");
      poVar7 = std::operator<<(poVar7,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 2));
      poVar7 = std::operator<<(poVar7,"\"");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::ifstream::~ifstream(&fin);
  }
  return iVar5;
}

Assistant:

int cmcmd::ExecuteLinkScript(std::vector<std::string>& args)
{
  // The arguments are
  //   argv[0] == <cmake-executable>
  //   argv[1] == cmake_link_script
  //   argv[2] == <link-script-name>
  //   argv[3] == --verbose=?
  bool verbose = false;
  if(args.size() >= 4)
    {
    if(args[3].find("--verbose=") == 0)
      {
      if(!cmSystemTools::IsOff(args[3].substr(10).c_str()))
        {
        verbose = true;
        }
      }
    }

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if(!cp)
    {
    std::cerr << "Error allocating process instance in link script."
              << std::endl;
    return 1;
    }

  // Children should share stdout and stderr with this process.
  cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
  cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);

  // Run the command lines verbatim.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);

  // Read command lines from the script.
  cmsys::ifstream fin(args[2].c_str());
  if(!fin)
    {
    std::cerr << "Error opening link script \""
              << args[2] << "\"" << std::endl;
    return 1;
    }

  // Run one command at a time.
  std::string command;
  int result = 0;
  while(result == 0 && cmSystemTools::GetLineFromStream(fin, command))
    {
    // Skip empty command lines.
    if(command.find_first_not_of(" \t") == command.npos)
      {
      continue;
      }

    // Setup this command line.
    const char* cmd[2] = {command.c_str(), 0};
    cmsysProcess_SetCommand(cp, cmd);

    // Report the command if verbose output is enabled.
    if(verbose)
      {
      std::cout << command << std::endl;
      }

    // Run the command and wait for it to exit.
    cmsysProcess_Execute(cp);
    cmsysProcess_WaitForExit(cp, 0);

    // Report failure if any.
    switch(cmsysProcess_GetState(cp))
      {
      case cmsysProcess_State_Exited:
        {
        int value = cmsysProcess_GetExitValue(cp);
        if(value != 0)
          {
          result = value;
          }
        }
        break;
      case cmsysProcess_State_Exception:
        std::cerr << "Error running link command: "
                  << cmsysProcess_GetExceptionString(cp) << std::endl;
        result = 1;
        break;
      case cmsysProcess_State_Error:
        std::cerr << "Error running link command: "
                  << cmsysProcess_GetErrorString(cp) << std::endl;
        result = 2;
        break;
      default:
        break;
      };
    }

  // Free the process instance.
  cmsysProcess_Delete(cp);

  // Return the final resulting return value.
  return result;
}